

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

ZSTD_CCtx * duckdb_zstd::ZSTD_initStaticCCtx(void *workspace,size_t workspaceSize)

{
  ZSTD_compressedBlockState_t *pZVar1;
  U32 *pUVar2;
  ZSTD_cwksp_alloc_phase_e ZVar3;
  uint *puVar4;
  long lVar5;
  U32 *pUVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  void *pvVar8;
  uint uVar9;
  ZSTD_compressedBlockState_t *pZVar10;
  ZSTD_CCtx *__s;
  
  if (((ulong)workspace & 7) != 0 || workspaceSize < 0x1481) {
    return (ZSTD_CCtx *)0x0;
  }
  __s = (ZSTD_CCtx *)workspace;
  pZVar10 = (ZSTD_compressedBlockState_t *)((long)workspace + 0x1480);
  if ((long)workspaceSize < 0x1480) {
    __s = (ZSTD_CCtx *)0x0;
    pZVar10 = (ZSTD_compressedBlockState_t *)workspace;
  }
  if (__s == (ZSTD_CCtx *)0x0) {
    return (ZSTD_CCtx *)0x0;
  }
  pZVar7 = (ZSTD_compressedBlockState_t *)((long)workspace + workspaceSize);
  pvVar8 = (void *)((ulong)pZVar7 & 0xffffffffffffffc0);
  switchD_0130b471::default(__s,0,0x1480);
  (__s->workspace).workspace = workspace;
  (__s->workspace).workspaceEnd = pZVar7;
  (__s->workspace).objectEnd = pZVar10;
  (__s->workspace).tableEnd = pZVar10;
  (__s->workspace).tableValidEnd = pZVar10;
  (__s->workspace).allocStart = pvVar8;
  (__s->workspace).initOnceStart = pvVar8;
  (__s->workspace).allocFailed = (long)workspaceSize < 0x1480;
  (__s->workspace).workspaceOversizedDuration = 0;
  (__s->workspace).phase = ZSTD_cwksp_alloc_objects;
  (__s->workspace).isStatic = ZSTD_cwksp_static_alloc;
  __s->staticSize = workspaceSize;
  if ((ulong)((long)pvVar8 - (long)pZVar10) < 0x4ed8) {
    return (ZSTD_CCtx *)0x0;
  }
  pZVar1 = pZVar10 + 1;
  if (pZVar7 < pZVar1) {
    (__s->workspace).allocFailed = '\x01';
    pZVar10 = (ZSTD_compressedBlockState_t *)0x0;
  }
  else {
    (__s->workspace).objectEnd = pZVar1;
    (__s->workspace).tableEnd = pZVar1;
    (__s->workspace).tableValidEnd = pZVar1;
  }
  (__s->blockState).prevCBlock = pZVar10;
  ZVar3 = (__s->workspace).phase;
  if (ZVar3 == ZSTD_cwksp_alloc_objects) {
    pZVar7 = (ZSTD_compressedBlockState_t *)(__s->workspace).objectEnd;
    pZVar10 = pZVar7 + 1;
    if (pZVar10 <= (ZSTD_compressedBlockState_t *)(__s->workspace).workspaceEnd) {
      (__s->workspace).objectEnd = pZVar10;
      (__s->workspace).tableEnd = pZVar10;
      (__s->workspace).tableValidEnd = pZVar10;
      goto LAB_018e20a5;
    }
  }
  (__s->workspace).allocFailed = '\x01';
  pZVar7 = (ZSTD_compressedBlockState_t *)0x0;
LAB_018e20a5:
  pUVar6 = (U32 *)(__s->workspace).objectEnd;
  (__s->blockState).nextCBlock = pZVar7;
  if ((ZVar3 == ZSTD_cwksp_alloc_objects) &&
     (pUVar2 = pUVar6 + 0x8b6, pUVar2 <= (__s->workspace).workspaceEnd)) {
    (__s->workspace).objectEnd = pUVar2;
    (__s->workspace).tableEnd = pUVar2;
    (__s->workspace).tableValidEnd = pUVar2;
  }
  else {
    (__s->workspace).allocFailed = '\x01';
    pUVar6 = (U32 *)0x0;
  }
  __s->entropyWorkspace = pUVar6;
  uVar9 = 0;
  puVar4 = (uint *)cpuid_basic_info(0);
  if (6 < *puVar4) {
    lVar5 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar9 = *(uint *)(lVar5 + 4) >> 8 & 1;
  }
  __s->bmi2 = uVar9;
  return __s;
}

Assistant:

ZSTD_CCtx* ZSTD_initStaticCCtx(void* workspace, size_t workspaceSize)
{
    ZSTD_cwksp ws;
    ZSTD_CCtx* cctx;
    if (workspaceSize <= sizeof(ZSTD_CCtx)) return NULL;  /* minimum size */
    if ((size_t)workspace & 7) return NULL;  /* must be 8-aligned */
    ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);

    cctx = (ZSTD_CCtx*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CCtx));
    if (cctx == NULL) return NULL;

    ZSTD_memset(cctx, 0, sizeof(ZSTD_CCtx));
    ZSTD_cwksp_move(&cctx->workspace, &ws);
    cctx->staticSize = workspaceSize;

    /* statically sized space. entropyWorkspace never moves (but prev/next block swap places) */
    if (!ZSTD_cwksp_check_available(&cctx->workspace, ENTROPY_WORKSPACE_SIZE + 2 * sizeof(ZSTD_compressedBlockState_t))) return NULL;
    cctx->blockState.prevCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->blockState.nextCBlock = (ZSTD_compressedBlockState_t*)ZSTD_cwksp_reserve_object(&cctx->workspace, sizeof(ZSTD_compressedBlockState_t));
    cctx->entropyWorkspace = (U32*)ZSTD_cwksp_reserve_object(&cctx->workspace, ENTROPY_WORKSPACE_SIZE);
    cctx->bmi2 = ZSTD_cpuid_bmi2(ZSTD_cpuid());
    return cctx;
}